

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rational.hpp
# Opt level: O2

rational<unsigned_long_long> * __thiscall
tcb::rational<unsigned_long_long>::operator/=
          (rational<unsigned_long_long> *this,rational<unsigned_long_long> *other)

{
  this->num_ = this->num_ * other->denom_;
  this->denom_ = this->denom_ * other->num_;
  simplify(this);
  return this;
}

Assistant:

TCB_CONSTEXPR14 rational& operator/=(const rational<U>& other)
    {
        num_ *= other.denom();
        denom_ *= other.num();
        simplify();
        return *this;
    }